

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serializer.hpp
# Opt level: O1

void __thiscall
duckdb::Serializer::WriteValue<duckdb::ColumnIndex>
          (Serializer *this,vector<duckdb::ColumnIndex,_true> *vec)

{
  pointer pCVar1;
  ColumnIndex *item;
  pointer this_00;
  
  (*this->_vptr_Serializer[8])
            (this,(long)(vec->
                        super_vector<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>).
                        super__Vector_base<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)(vec->
                        super_vector<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>).
                        super__Vector_base<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>
                        ._M_impl.super__Vector_impl_data._M_start >> 5);
  pCVar1 = (vec->super_vector<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>).
           super__Vector_base<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (this_00 = (vec->super_vector<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>).
                 super__Vector_base<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>.
                 _M_impl.super__Vector_impl_data._M_start; this_00 != pCVar1; this_00 = this_00 + 1)
  {
    (*this->_vptr_Serializer[6])(this);
    ColumnIndex::Serialize(this_00,this);
    (*this->_vptr_Serializer[7])(this);
  }
  (*this->_vptr_Serializer[9])(this);
  return;
}

Assistant:

void WriteValue(const vector<T> &vec) {
		auto count = vec.size();
		OnListBegin(count);
		for (auto &item : vec) {
			WriteValue(item);
		}
		OnListEnd();
	}